

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O2

void cmVariableWatchCommandVariableAccessed
               (string *variable,int access_type,void *client_data,char *newValue,cmMakefile *mf)

{
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *this;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  cmExecutionStatus status;
  string local_280;
  char *local_260;
  string stack;
  ostringstream error;
  cmListFileFunction newLFF;
  cmListFileArgument arg;
  
  if (*client_data != '\0') {
    return;
  }
  *(undefined1 *)client_data = 1;
  newLFF.super_cmListFileContext.Name._M_dataplus._M_p =
       (pointer)&newLFF.super_cmListFileContext.Name.field_2;
  newLFF.super_cmListFileContext.Name._M_string_length = 0;
  newLFF.super_cmListFileContext.Name.field_2._M_local_buf[0] = '\0';
  newLFF.super_cmListFileContext.FilePath._M_dataplus._M_p =
       (pointer)&newLFF.super_cmListFileContext.FilePath.field_2;
  newLFF.super_cmListFileContext.FilePath._M_string_length = 0;
  arg.Value._M_dataplus._M_p = (pointer)&arg.Value.field_2;
  arg.Value._M_string_length = 0;
  newLFF.super_cmListFileContext.FilePath.field_2._M_local_buf[0] = '\0';
  arg.Value.field_2._M_local_buf[0] = '\0';
  newLFF.super_cmListFileContext.Line = 0;
  newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arg.Delim = Unquoted;
  newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arg.Line = 0;
  pcVar2 = cmVariableWatch::GetAccessAsString(access_type);
  std::__cxx11::string::string((string *)&error,"CMAKE_CURRENT_LIST_FILE",(allocator *)&stack);
  pcVar3 = cmMakefile::GetDefinition(mf,(string *)&error);
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::string((string *)&error,"LISTFILE_STACK",(allocator *)&local_280);
  pcVar4 = cmMakefile::GetProperty(mf,(string *)&error);
  std::__cxx11::string::string((string *)&stack,pcVar4,(allocator *)&status);
  std::__cxx11::string::~string((string *)&error);
  if (*(long *)((long)client_data + 0x10) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
    poVar5 = std::operator<<((ostream *)&error,"Variable \"");
    poVar5 = std::operator<<(poVar5,(string *)variable);
    poVar5 = std::operator<<(poVar5,"\" was accessed using ");
    poVar5 = std::operator<<(poVar5,pcVar2);
    poVar5 = std::operator<<(poVar5," with value \"");
    pcVar2 = "";
    if (newValue != (char *)0x0) {
      pcVar2 = newValue;
    }
    poVar5 = std::operator<<(poVar5,pcVar2);
    std::operator<<(poVar5,"\".");
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(mf,LOG,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
  }
  else {
    this = &newLFF.Arguments;
    local_260 = pcVar3;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::clear(this);
    std::__cxx11::string::string((string *)&error,(string *)variable);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
    emplace_back<cmListFileArgument>(this,(cmListFileArgument *)&error);
    std::__cxx11::string::~string((string *)&error);
    std::__cxx11::string::string((string *)&local_280,pcVar2,(allocator *)&status);
    std::__cxx11::string::string((string *)&error,(string *)&local_280);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
    emplace_back<cmListFileArgument>(this,(cmListFileArgument *)&error);
    std::__cxx11::string::~string((string *)&error);
    std::__cxx11::string::~string((string *)&local_280);
    pcVar2 = "";
    if (newValue != (char *)0x0) {
      pcVar2 = newValue;
    }
    std::__cxx11::string::string((string *)&local_280,pcVar2,(allocator *)&status);
    std::__cxx11::string::string((string *)&error,(string *)&local_280);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
    emplace_back<cmListFileArgument>(this,(cmListFileArgument *)&error);
    std::__cxx11::string::~string((string *)&error);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,local_260,(allocator *)&status);
    std::__cxx11::string::string((string *)&error,(string *)&local_280);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
    emplace_back<cmListFileArgument>(this,(cmListFileArgument *)&error);
    std::__cxx11::string::~string((string *)&error);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&error,(string *)&stack);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
    emplace_back<cmListFileArgument>(this,(cmListFileArgument *)&error);
    std::__cxx11::string::~string((string *)&error);
    std::__cxx11::string::_M_assign((string *)&newLFF);
    std::__cxx11::string::assign((char *)&newLFF.super_cmListFileContext.FilePath);
    newLFF.super_cmListFileContext.Line = 9999;
    status.ReturnInvoked = false;
    status.BreakInvoked = false;
    status.ContinueInvoked = false;
    status.NestedError = false;
    bVar1 = cmMakefile::ExecuteCommand(mf,&newLFF,&status);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
      poVar5 = std::operator<<((ostream *)&error,"Error in cmake code at\nUnknown:0:\n");
      poVar5 = std::operator<<(poVar5,"A command failed during the invocation of callback \"");
      poVar5 = std::operator<<(poVar5,(string *)((long)client_data + 8));
      std::operator<<(poVar5,"\".");
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(local_280._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)&local_280);
      *(undefined1 *)client_data = 0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
      goto LAB_002e2bea;
    }
  }
  *(undefined1 *)client_data = 0;
LAB_002e2bea:
  std::__cxx11::string::~string((string *)&stack);
  std::__cxx11::string::~string((string *)&arg);
  cmListFileFunction::~cmListFileFunction(&newLFF);
  return;
}

Assistant:

static void cmVariableWatchCommandVariableAccessed(
  const std::string& variable, int access_type, void* client_data,
  const char* newValue, const cmMakefile* mf)
{
  cmVariableWatchCallbackData* data
    = static_cast<cmVariableWatchCallbackData*>(client_data);

  if ( data->InCallback )
    {
    return;
    }
  data->InCallback = true;

  cmListFileFunction newLFF;
  cmListFileArgument arg;
  bool processed = false;
  const char* accessString = cmVariableWatch::GetAccessAsString(access_type);
  const char* currentListFile = mf->GetDefinition("CMAKE_CURRENT_LIST_FILE");

  /// Ultra bad!!
  cmMakefile* makefile = const_cast<cmMakefile*>(mf);

  std::string stack = makefile->GetProperty("LISTFILE_STACK");
  if ( !data->Command.empty() )
    {
    newLFF.Arguments.clear();
    newLFF.Arguments.push_back(
      cmListFileArgument(variable, cmListFileArgument::Quoted,
                         9999));
    newLFF.Arguments.push_back(
      cmListFileArgument(accessString, cmListFileArgument::Quoted,
                         9999));
    newLFF.Arguments.push_back(
      cmListFileArgument(newValue?newValue:"", cmListFileArgument::Quoted,
                         9999));
    newLFF.Arguments.push_back(
      cmListFileArgument(currentListFile, cmListFileArgument::Quoted,
                         9999));
    newLFF.Arguments.push_back(
      cmListFileArgument(stack, cmListFileArgument::Quoted,
                         9999));
    newLFF.Name = data->Command;
    newLFF.FilePath = "unknown";
    newLFF.Line = 9999;
    cmExecutionStatus status;
    if(!makefile->ExecuteCommand(newLFF,status))
      {
      std::ostringstream error;
      error << "Error in cmake code at\nUnknown:0:\n"
        << "A command failed during the invocation of callback \""
        << data->Command << "\".";
      cmSystemTools::Error(error.str().c_str());
      data->InCallback = false;
      return;
      }
    processed = true;
    }
  if ( !processed )
    {
    std::ostringstream msg;
    msg << "Variable \"" << variable << "\" was accessed using "
        << accessString << " with value \"" << (newValue?newValue:"") << "\".";
    makefile->IssueMessage(cmake::LOG, msg.str());
    }

  data->InCallback = false;
}